

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle_test.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  element_type *peVar2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  reference this;
  reference pvVar6;
  reference pvVar7;
  int local_12c;
  undefined1 local_128 [4];
  int i;
  AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState> anytime_stats;
  undefined1 local_a8 [8];
  Ptr goal_state;
  Ptr start_state;
  shared_ptr<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  local_78;
  undefined1 local_68 [8];
  shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  planner;
  double dStack_50;
  int num_inad;
  double del_mha_eps;
  double mha_eps;
  double del_eps;
  double eps;
  double time_limit;
  Ptr env_ptr;
  int local_10;
  int puzzle_anchor;
  int puzzle_size;
  
  puzzle_anchor = 0;
  local_10 = 5;
  env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  std::make_shared<sliding_puzzle::SlidingPuzzle,int&,int&>((int *)&time_limit,&local_10);
  eps = 10.0;
  del_eps = 10.0;
  mha_eps = 1.0;
  del_mha_eps = 10.0;
  dStack_50 = 1.0;
  planner.
  super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 4;
  std::
  shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  ::shared_ptr((shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
                *)local_68);
  std::
  make_shared<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzle>&,double&,double&,double&,double&,double&,int&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzle> *)&local_78,&time_limit,&eps,&del_eps,
             &del_mha_eps,&mha_eps,(int *)&stack0xffffffffffffffb0);
  std::
  shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>>
  ::operator=((shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>>
               *)local_68,&local_78);
  std::
  shared_ptr<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  ::~shared_ptr(&local_78);
  std::__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&time_limit);
  sliding_puzzle::SlidingPuzzle::getStartState
            ((SlidingPuzzle *)
             &goal_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&time_limit);
  sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)local_a8);
  peVar2 = std::
           __shared_ptr_access<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  uVar1 = (**peVar2->_vptr_Dijkstra)
                    (peVar2,&goal_state.
                             super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,local_a8);
  if ((uVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Plannar did not return any solution. Error!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    puzzle_anchor = 0;
    anytime_stats.num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    peVar2 = std::
             __shared_ptr_access<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    (*peVar2->_vptr_Dijkstra[2])(local_128);
    poVar3 = std::operator<<((ostream *)&std::cout,"The num solutions found are: ");
    sVar4 = std::
            vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
            ::size((vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                    *)local_128);
    pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    local_12c = 0;
    while( true ) {
      sVar4 = std::
              vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
              ::size((vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                      *)local_128);
      if (sVar4 <= (ulong)(long)local_12c) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"Path lengths are: ");
      this = std::
             vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
             ::operator[]((vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                           *)local_128,(long)local_12c);
      sVar4 = std::
              vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
              ::size(this);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
      poVar3 = std::operator<<(poVar3," with epsilon: ");
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &anytime_stats.solution_paths_.
                           super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_12c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
      poVar3 = std::operator<<(poVar3," and planning time is: ");
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &anytime_stats.solution_eps_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_12c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
      poVar3 = std::operator<<(poVar3," and hash time is: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sliding_puzzle::hash_time);
      poVar3 = std::operator<<(poVar3," and num expansions is: ");
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &anytime_stats.cummulative_time_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_12c);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,*pvVar7);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      local_12c = local_12c + 1;
    }
    puzzle_anchor = 0;
    anytime_stats.num_expansions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    csbpl_planner::AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>::~AnytimePlannerStats
              ((AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState> *)local_128);
  }
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)local_a8);
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)
             &goal_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  ::~shared_ptr((shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
                 *)local_68);
  std::shared_ptr<sliding_puzzle::SlidingPuzzle>::~shared_ptr
            ((shared_ptr<sliding_puzzle::SlidingPuzzle> *)&time_limit);
  return puzzle_anchor;
}

Assistant:

int main()
{
  typedef csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> DijkstraType;
  typedef csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> AMHAStarType;

  int puzzle_size = 5;
  int puzzle_anchor = 0;
  sliding_puzzle::SlidingPuzzle::Ptr env_ptr =
    std::make_shared<sliding_puzzle::SlidingPuzzle>(puzzle_size,
                                                    puzzle_anchor);

  double time_limit = 10;
  double eps = 10;
  double del_eps = 1;
  
  double mha_eps = 10;
  double del_mha_eps = 1;
  
  int num_inad = 4;

  std::shared_ptr<DijkstraType> planner;
  planner = std::make_shared<AMHAStarType>(env_ptr,
                                           time_limit,
                                           eps,
                                           mha_eps,
                                           del_eps,
                                           del_mha_eps,
                                           num_inad);

  sliding_puzzle::SlidingPuzzleState::Ptr start_state = env_ptr->getStartState();
  sliding_puzzle::SlidingPuzzleState::Ptr goal_state = env_ptr->getGoalState();

  
  if (!planner->run(start_state, goal_state))
  {
    std::cout << "Plannar did not return any solution. Error!" << std::endl;
    return 0;
  }

  csbpl_planner::AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>
    anytime_stats = planner->getAnytimePlannerStats();
  std::cout << "The num solutions found are: "
            << anytime_stats.solution_paths_.size() << std::endl;
  
  for (int i=0; i<anytime_stats.solution_paths_.size(); ++i)
  {
    std::cout << "Path lengths are: " << anytime_stats.solution_paths_[i].size()
              << " with epsilon: " << anytime_stats.solution_eps_[i]
              << " and planning time is: " << anytime_stats.solution_time_[i]
              << " and hash time is: " << sliding_puzzle::hash_time
              << " and num expansions is: " << anytime_stats.num_expansions_[i] << std::endl;
  }

  return 0;
}